

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random_keys.cpp
# Opt level: O1

void __thiscall
Random_keys::cruzamento3
          (Random_keys *this,RK_Individual *pai1,RK_Individual *pai2,RK_Individual *filho)

{
  double *pdVar1;
  double *pdVar2;
  pointer ppCVar3;
  pointer ppCVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_38;
  
  ppCVar4 = RK_Individual::cromossomos.
            super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppCVar3 = RK_Individual::cromossomos.
            super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar5 = time((time_t *)0x0);
  local_38._M_x = uVar5 % 0x7fffffff + (ulong)(uVar5 % 0x7fffffff == 0);
  std::
  shuffle<__gnu_cxx::__normal_iterator<Chromosome**,std::vector<Chromosome*,std::allocator<Chromosome*>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
            ((__normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
              )ppCVar3,
             (__normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
              )ppCVar4,&local_38);
  ppCVar4 = RK_Individual::cromossomos.
            super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppCVar3 = RK_Individual::cromossomos.
            super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar5 = (long)RK_Individual::cromossomos.
                super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)RK_Individual::cromossomos.
                super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  uVar6 = uVar5 >> 1;
  if (1 < uVar5) {
    pdVar1 = pai1->weights;
    pdVar2 = filho->weights;
    uVar7 = 0;
    do {
      pdVar2[ppCVar3[uVar7]->position] = pdVar1[ppCVar3[uVar7]->position];
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  if (ppCVar4 != ppCVar3) {
    pdVar1 = pai2->weights;
    pdVar2 = filho->weights;
    do {
      pdVar2[ppCVar3[uVar6]->position] = pdVar1[ppCVar3[uVar6]->position];
      uVar6 = uVar6 + 1;
    } while (uVar6 < uVar5);
  }
  return;
}

Assistant:

void Random_keys::cruzamento3(RK_Individual *pai1, RK_Individual *pai2, RK_Individual *filho) {
    shuffle(RK_Individual::cromossomos.begin(), RK_Individual::cromossomos.end(), std::default_random_engine(time(NULL)));

    for(unsigned long int i=0; i<RK_Individual::cromossomos.size()/2; i++)
        filho->getWeights()[RK_Individual::cromossomos.at(i)->position] = pai1->getWeights()[RK_Individual::cromossomos.at(i)->position];

    for(unsigned long int i=RK_Individual::cromossomos.size()/2; i<RK_Individual::cromossomos.size(); i++)
        filho->getWeights()[RK_Individual::cromossomos.at(i)->position] = pai2->getWeights()[RK_Individual::cromossomos.at(i)->position];

}